

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::RollforwardBlock(Chainstate *this,CBlockIndex *pindex,CCoinsViewCache *inputs)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  bool bVar4;
  CTransaction *tx_00;
  CTxIn *txin;
  pointer outpoint;
  CTransactionRef *tx;
  pointer psVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  base_blob<256u> local_e8 [32];
  string local_c8;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  bVar3 = ::node::BlockManager::ReadBlockFromDisk(this->m_blockman,&block,pindex);
  psVar5 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar3) {
    for (; psVar5 != block.vtx.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      bVar4 = CTransaction::IsCoinBase
                        ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      tx_00 = (psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (!bVar4) {
        pCVar2 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (outpoint = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start; outpoint != pCVar2;
            outpoint = outpoint + 1) {
          CCoinsViewCache::SpendCoin(inputs,&outpoint->prevout,(Coin *)0x0);
        }
        tx_00 = (psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      AddCoins(inputs,tx_00,pindex->nHeight,true);
    }
  }
  else {
    CBlockIndex::GetBlockHash((uint256 *)local_e8,pindex);
    base_blob<256u>::ToString_abi_cxx11_(&local_c8,local_e8);
    logging_function._M_str = "RollforwardBlock";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<int,std::__cxx11::string>
              (logging_function,source_file,0x12e1,ALL,Error,(ConstevalFormatString<2U>)0x6c4fda,
               &pindex->nHeight,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Chainstate::RollforwardBlock(const CBlockIndex* pindex, CCoinsViewCache& inputs)
{
    AssertLockHeld(cs_main);
    // TODO: merge with ConnectBlock
    CBlock block;
    if (!m_blockman.ReadBlockFromDisk(block, *pindex)) {
        LogError("ReplayBlock(): ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
        return false;
    }

    for (const CTransactionRef& tx : block.vtx) {
        if (!tx->IsCoinBase()) {
            for (const CTxIn &txin : tx->vin) {
                inputs.SpendCoin(txin.prevout);
            }
        }
        // Pass check = true as every addition may be an overwrite.
        AddCoins(inputs, *tx, pindex->nHeight, true);
    }
    return true;
}